

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal.h
# Opt level: O0

block_size_descriptor * aligned_malloc<block_size_descriptor>(size_t size,size_t align)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long in_RSI;
  size_t in_RDI;
  size_t real_align;
  size_t min_align;
  int error;
  void *ptr;
  block_size_descriptor *local_20;
  unsigned_long local_18;
  size_t local_10;
  block_size_descriptor *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = astc::max<unsigned_long>(0x20,8);
  uVar2 = astc::max<unsigned_long>(uVar2,local_18);
  iVar1 = posix_memalign(&local_20,uVar2,local_10);
  if ((iVar1 == 0) && (local_20 != (block_size_descriptor *)0x0)) {
    local_8 = local_20;
  }
  else {
    local_8 = (block_size_descriptor *)0x0;
  }
  return local_8;
}

Assistant:

T* aligned_malloc(size_t size, size_t align)
{
	void* ptr;
	int error = 0;

	// Don't allow this to under-align a type
	size_t min_align = astc::max(alignof(T), sizeof(void*));
	size_t real_align = astc::max(min_align, align);

#if defined(_WIN32)
	ptr = _aligned_malloc(size, real_align);
#else
	error = posix_memalign(&ptr, real_align, size);
#endif

	if (error || (!ptr))
	{
		return nullptr;
	}

	return static_cast<T*>(ptr);
}